

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_test.cpp
# Opt level: O2

void test_ptr<std::shared_ptr<int>>(void)

{
  char cVar1;
  int *piVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  shared_ptr<int> y;
  shared_ptr<int> x;
  string local_1e8 [32];
  archive a;
  ostringstream oss;
  
  cppcms::archive::archive(&a);
  piVar2 = (int *)operator_new(4);
  *piVar2 = 0xf;
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&x,piVar2);
  y.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  y.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cppcms::operator&(&a,&x);
  cppcms::archive::mode(&a,1);
  cppcms::operator&(&a,&y);
  if ((x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       y.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr) ||
     (*x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      *y.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x7a);
    std::operator<<(poVar3," *x==*y && x.get()!=y.get()");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,local_1e8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar1 = cppcms::archive::eof();
  if (cVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x7b);
    std::operator<<(poVar3," a.eof()");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,local_1e8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&y.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cppcms::archive::~archive(&a);
  cppcms::archive::archive(&a);
  piVar2 = (int *)operator_new(4);
  *piVar2 = 0xf;
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&x,piVar2);
  y.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  y.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cppcms::archive_traits<std::shared_ptr<int>,_void>::save(&x,&a);
  cppcms::archive::mode(&a,1);
  cppcms::archive_traits<std::shared_ptr<int>,_void>::load(&y,&a);
  if ((x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       y.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr) ||
     (*x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      *y.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x85);
    std::operator<<(poVar3," *x==*y && x.get()!=y.get()");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,local_1e8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar1 = cppcms::archive::eof();
  if (cVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x86);
    std::operator<<(poVar3," a.eof()");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,local_1e8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&y.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cppcms::archive::~archive(&a);
  cppcms::archive::archive(&a);
  x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  piVar2 = (int *)operator_new(4);
  *piVar2 = 0xf;
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&y,piVar2);
  cppcms::operator&(&a,&x);
  cppcms::archive::mode(&a,1);
  cppcms::operator&(&a,&y);
  if (y.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x8f);
    std::operator<<(poVar3," y.get()==0");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,local_1e8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar1 = cppcms::archive::eof();
  if (cVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x90);
    std::operator<<(poVar3," a.eof()");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,local_1e8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&y.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cppcms::archive::~archive(&a);
  cppcms::archive::archive(&a);
  x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  piVar2 = (int *)operator_new(4);
  *piVar2 = 0xf;
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&y,piVar2);
  cppcms::archive_traits<std::shared_ptr<int>,_void>::save(&x,&a);
  cppcms::archive::mode(&a,1);
  cppcms::archive_traits<std::shared_ptr<int>,_void>::load(&y,&a);
  if (y.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    cVar1 = cppcms::archive::eof();
    if (cVar1 != '\0') {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&y.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      cppcms::archive::~archive(&a);
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x9a);
    std::operator<<(poVar3," a.eof()");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,local_1e8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar3 = std::operator<<((ostream *)&oss,"Error ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x99);
  std::operator<<(poVar3," y.get()==0");
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,local_1e8);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_ptr()
{
	{
		cppcms::archive a;
		Pointer x(new int(15)),y;
		a & x;
		a.mode(cppcms::archive::load_from_archive);
		a & y;
		TEST(*x==*y && x.get()!=y.get());
		TEST(a.eof());

	}
	{
		cppcms::archive a;
		Pointer const x(new int(15));
		Pointer y;
		a << x;
		a.mode(cppcms::archive::load_from_archive);
		a >> y;
		TEST(*x==*y && x.get()!=y.get());
		TEST(a.eof());

	}
	{
		cppcms::archive a;
		Pointer x,y(new int(15));
		a & x;
		a.mode(cppcms::archive::load_from_archive);
		a & y;
		TEST(y.get()==0);
		TEST(a.eof());
	}
	{
		cppcms::archive a;
		Pointer const x;
		Pointer y(new int(15));
		a << x;
		a.mode(cppcms::archive::load_from_archive);
		a >> y;
		TEST(y.get()==0);
		TEST(a.eof());
	}

}